

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

ostream_inserter
pstore::to_base64<unsigned_char_const*,pstore::exchange::export_ns::ostream_inserter>
          (uchar *first,uchar *last,ostream_inserter out)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  size_t __n;
  void *pvVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *__buf_02;
  void *extraout_RDX_00;
  void *__buf_03;
  void *extraout_RDX_01;
  void *pvVar6;
  void *__buf_04;
  long lVar7;
  
  __n = (long)last - (long)first;
  lVar7 = (long)__n / 3;
  pvVar5 = (void *)((long)__n % 3);
  pvVar6 = pvVar5;
  if (2 < (long)__n) {
    do {
      bVar1 = *first;
      __n = (ulong)bVar1 << 0x10;
      bVar2 = first[1];
      bVar3 = first[2];
      first = first + 3;
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[bVar1 >> 2],pvVar6,__n);
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems
                              [((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f],__buf,__n)
      ;
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[(uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f],
                 __buf_00,__n);
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[bVar3 & 0x3f],__buf_01,__n);
      lVar7 = lVar7 + -1;
      pvVar6 = extraout_RDX;
    } while (lVar7 != 0);
  }
  if (pvVar5 != (void *)0x0) {
    if (pvVar5 == (void *)0x1) {
      bVar1 = *first;
      first = first + 1;
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[bVar1 >> 2],(void *)0x1,__n);
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[(bVar1 & 3) << 4],__buf_03,__n);
      cVar4 = '=';
      pvVar6 = extraout_RDX_01;
    }
    else {
      if (pvVar5 != (void *)0x2) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                      ,0x4e);
      }
      bVar1 = *first;
      __n = (ulong)bVar1 << 0x10;
      bVar2 = first[1];
      first = first + 2;
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems[bVar1 >> 2],(void *)0x2,__n);
      exchange::export_ns::ostream_base::write
                (out.os_,(int)to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                              ::alphabet._M_elems
                              [((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f],__buf_02,__n)
      ;
      cVar4 = to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>::
              alphabet._M_elems[(ulong)(bVar2 & 0xf) * 4];
      pvVar6 = extraout_RDX_00;
    }
    exchange::export_ns::ostream_base::write(out.os_,(int)cVar4,pvVar6,__n);
    exchange::export_ns::ostream_base::write(out.os_,0x3d,__buf_04,__n);
  }
  if (first != last) {
    assert_failed("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                  ,0x51);
  }
  return (ostream_inserter)out.os_;
}

Assistant:

OutputIterator to_base64 (ForwardIterator first, ForwardIterator last, OutputIterator out) {
        static constexpr std::array<char, 64> alphabet{
            {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P',
             'Q', 'R', 'S', 'T', 'U', 'V', 'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f',
             'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v',
             'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'}};
        auto const size = std::distance (first, last);
        // Consume the input, converting three input bytes to four output characters.
        for (auto index = decltype (size){0}; index < size / 3; ++index) {
            auto value1 = static_cast<std::uint32_t> (*(first++) << 16);
            value1 += static_cast<std::uint32_t> (*(first++) << 8);
            value1 += static_cast<std::uint32_t> (*(first++));

            *(out++) = alphabet[(value1 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value1 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value1 & 0x00000FC0) >> 6];
            *(out++) = alphabet[value1 & 0x0000003F];
        }

        // Deal with the remaining 0..2 characters.
        switch (size % 3) {
        case 0: break;
        case 1: {
            auto const value2 = static_cast<std::uint32_t> (*(first++) << 16);

            *(out++) = alphabet[(value2 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value2 & 0x0003F000) >> 12];
            *(out++) = '=';
            *(out++) = '=';
        } break;
        case 2: {
            auto value3 = static_cast<std::uint32_t> (*(first++) << 16);
            value3 += static_cast<std::uint32_t> (*(first++) << 8);

            *(out++) = alphabet[(value3 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value3 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value3 & 0x00000FC0) >> 6];
            *(out++) = '=';
        } break;
        default:
            PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about a conditional constant)
            break;
        }
        PSTORE_ASSERT (first == last);
        return out;
    }